

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase263::run(TestCase263 *this)

{
  Reader reader_00;
  Builder builder_00;
  word *pwVar1;
  size_t sVar2;
  size_t in_RCX;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  ReaderOptions options;
  Array<capnp::word> serialized;
  TestInputStream stream;
  InputStreamMessageReader reader;
  TestMessageBuilder builder;
  Array<capnp::word> local_318;
  PointerReader local_2f8;
  StructBuilder local_2d0;
  InputStream local_2a8;
  word *local_2a0;
  word *local_298;
  undefined1 local_290;
  Reader local_288;
  SegmentReader *local_268;
  CapTableReader *pCStack_260;
  void *local_258;
  WirePointer *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc0;
  TestMessageBuilder local_100;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_100.super_MallocMessageBuilder,0,FIXED_SIZE);
  local_100.super_MallocMessageBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&PTR__TestMessageBuilder_003744c0;
  local_100.desiredSegmentCount = 1;
  MessageBuilder::getRootInternal((Builder *)&local_2f8,(MessageBuilder *)&local_100);
  PointerBuilder::initStruct
            (&local_2d0,(PointerBuilder *)&stack0xfffffffffffffdc8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdb8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdb0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffdc0;
  builder_00._builder.pointers = (WirePointer *)local_2f8.segment;
  builder_00._builder._32_8_ = local_2f8.capTable;
  initTestMessage(builder_00);
  AVar3 = MessageBuilder::getSegmentsForOutput((MessageBuilder *)&local_100);
  segments.ptr = (ArrayPtr<const_capnp::word> *)AVar3.size_;
  segments.size_ = in_RCX;
  messageToFlatArray(&local_318,(capnp *)AVar3.ptr,segments);
  local_2a8._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_00374590;
  local_2a0 = local_318.ptr;
  local_298 = local_318.ptr + local_318.size_;
  local_290 = 1;
  options._8_8_ = 0x40;
  options.traversalLimitInWords = 0x800000;
  InputStreamMessageReader::InputStreamMessageReader
            ((InputStreamMessageReader *)&stack0xfffffffffffffdc8,&local_2a8,options,
             (ArrayPtr<capnp::word>)ZEXT816(0));
  MessageReader::getRootInternal(&local_288,(MessageReader *)&stack0xfffffffffffffdc8);
  local_2f8.pointer = local_288.reader.pointer;
  local_2f8.nestingLimit = local_288.reader.nestingLimit;
  local_2f8._28_4_ = local_288.reader._28_4_;
  local_2f8.segment = local_288.reader.segment;
  local_2f8.capTable = local_288.reader.capTable;
  PointerReader::getStruct((StructReader *)&local_268,&local_2f8,(word *)0x0);
  reader_00._reader.capTable = pCStack_260;
  reader_00._reader.segment = local_268;
  reader_00._reader.data = local_258;
  reader_00._reader.pointers = in_stack_fffffffffffffdb0;
  reader_00._reader.dataSize = (StructDataBitCount)in_stack_fffffffffffffdb8;
  reader_00._reader.pointerCount = SUB82(in_stack_fffffffffffffdb8,4);
  reader_00._reader._38_2_ = SUB82(in_stack_fffffffffffffdb8,6);
  reader_00._reader.nestingLimit = (int)in_stack_fffffffffffffdc0;
  reader_00._reader._44_4_ = SUB84(in_stack_fffffffffffffdc0,4);
  checkTestMessage(reader_00);
  InputStreamMessageReader::~InputStreamMessageReader
            ((InputStreamMessageReader *)&stack0xfffffffffffffdc8);
  kj::BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&local_2a8);
  sVar2 = local_318.size_;
  pwVar1 = local_318.ptr;
  if (local_318.ptr != (word *)0x0) {
    local_318.ptr = (word *)0x0;
    local_318.size_ = 0;
    (*(code *)**(undefined8 **)local_318.disposer)(local_318.disposer,pwVar1,8,sVar2,sVar2,0);
  }
  TestMessageBuilder::~TestMessageBuilder(&local_100);
  return;
}

Assistant:

TEST(Serialize, InputStreamLazy) {
  TestMessageBuilder builder(1);
  initTestMessage(builder.initRoot<TestAllTypes>());

  kj::Array<word> serialized = messageToFlatArray(builder);

  TestInputStream stream(serialized.asPtr(), true);
  InputStreamMessageReader reader(stream, ReaderOptions());

  checkTestMessage(reader.getRoot<TestAllTypes>());
}